

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prevector_tests.cpp
# Opt level: O2

void __thiscall
prevector_tests::prevector_tester<8U,_int>::update
          (prevector_tester<8U,_int> *this,Size pos,int *value)

{
  int iVar1;
  long lVar2;
  pretype *ppVar3;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = *value;
  (this->real_vector).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start[pos] = iVar1;
  if ((this->pre_vector)._size < 9) {
    ppVar3 = &this->pre_vector;
  }
  else {
    ppVar3 = (pretype *)(this->pre_vector)._union.indirect_contents.indirect;
  }
  *(int *)((long)&ppVar3->_union + (long)(int)pos * 4) = iVar1;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    test(this);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void update(Size pos, const T& value) {
        real_vector[pos] = value;
        pre_vector[pos] = value;
        test();
    }